

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

HasHasbitTestParam * __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<google::protobuf::descriptor_unittest::HasHasbitTestParam>::Iterator
::Current(Iterator *this)

{
  HasHasbitTestParam *pHVar1;
  
  pHVar1 = (this->value_)._M_t.
           super___uniq_ptr_impl<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
           .
           super__Head_base<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_false>
           ._M_head_impl;
  if (pHVar1 == (HasHasbitTestParam *)0x0) {
    pHVar1 = (HasHasbitTestParam *)operator_new(0x28);
    google::protobuf::descriptor_unittest::HasHasbitTestParam::HasHasbitTestParam
              (pHVar1,(this->iterator_)._M_current);
    std::
    __uniq_ptr_impl<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
    ::reset((__uniq_ptr_impl<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
             *)&this->value_,pHVar1);
    pHVar1 = (this->value_)._M_t.
             super___uniq_ptr_impl<const_google::protobuf::descriptor_unittest::HasHasbitTestParam,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_std::default_delete<const_google::protobuf::descriptor_unittest::HasHasbitTestParam>_>
             .
             super__Head_base<0UL,_const_google::protobuf::descriptor_unittest::HasHasbitTestParam_*,_false>
             ._M_head_impl;
  }
  return pHVar1;
}

Assistant:

virtual ~ParamGeneratorInterface() = default;